

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTElement.h
# Opt level: O0

ostream * ninx::parser::element::operator<<(ostream *strm,ASTElement *a)

{
  ostream *poVar1;
  string local_38 [32];
  ASTElement *local_18;
  ASTElement *a_local;
  ostream *strm_local;
  
  local_18 = a;
  a_local = (ASTElement *)strm;
  (*a->_vptr_ASTElement[3])(local_38,a,0);
  poVar1 = std::operator<<(strm,local_38);
  std::__cxx11::string::~string(local_38);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream &strm, const ASTElement &a) {
                    return strm << a.dump(0);
                }